

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void gl4cts::EnhancedLayouts::Utils::replaceToken
               (GLchar *token,size_t *search_position,GLchar *text,string *string)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  size_t token_position;
  size_t token_length;
  size_t text_length;
  string *string_local;
  GLchar *text_local;
  size_t *search_position_local;
  GLchar *token_local;
  
  sVar1 = strlen(text);
  pcVar2 = (char *)strlen(token);
  uVar3 = std::__cxx11::string::find((char *)string,(ulong)token);
  std::__cxx11::string::replace((ulong)string,uVar3,pcVar2,(ulong)text);
  *search_position = uVar3 + sVar1;
  return;
}

Assistant:

void replaceToken(const GLchar* token, size_t& search_position, const GLchar* text, std::string& string)
{
	const size_t text_length	= strlen(text);
	const size_t token_length   = strlen(token);
	const size_t token_position = string.find(token, search_position);

#if DEBUG_REPLACE_TOKEN
	if (std::string::npos == token_position)
	{
		string.append("\n\nInvalid token: ");
		string.append(token);

		TCU_FAIL(string.c_str());
	}
#endif /* DEBUG_REPLACE_TOKEN */

	string.replace(token_position, token_length, text, text_length);

	search_position = token_position + text_length;
}